

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_hwm.cpp
# Opt level: O0

void KokkosTools::HighwaterMark::kokkosp_finalize_library(void)

{
  undefined1 local_98 [8];
  rusage sys_resources;
  
  printf("\n");
  printf("KokkosP: Finalization of profiling library.\n");
  getrusage(RUSAGE_SELF,(rusage *)local_98);
  printf("KokkosP: High water mark memory consumption: %li kB\n",sys_resources.ru_stime.tv_usec);
  printf("\n");
  return;
}

Assistant:

void kokkosp_finalize_library() {
  printf("\n");
  printf("KokkosP: Finalization of profiling library.\n");

  struct rusage sys_resources;
  getrusage(RUSAGE_SELF, &sys_resources);

  printf("KokkosP: High water mark memory consumption: %li kB\n",
         (long)sys_resources.ru_maxrss * RU_MAXRSS_UNITS);
  printf("\n");
}